

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

bool axl::io::ensureDirExists(StringRef *fileName0)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *__path;
  char *pcVar6;
  char *pcVar7;
  String fileName;
  StringRef local_50;
  
  bVar3 = true;
  if ((fileName0->m_length != 0) && (bVar2 = isDir(fileName0), !bVar2)) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_50,fileName0);
    bVar3 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::ensureExclusive
                      ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_50);
    pcVar7 = local_50.m_p;
    if (!bVar3) {
      pcVar7 = (char *)0x0;
    }
    pcVar7 = pcVar7 + -1;
    do {
      pcVar6 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (*pcVar6 == '/');
    do {
      bVar3 = true;
      pcVar6 = pcVar7;
      if (*pcVar7 == '\0') goto LAB_00137491;
      do {
        cVar1 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
        if (cVar1 == '/') break;
      } while (cVar1 != '\0');
      *pcVar6 = '\0';
      bVar2 = isDir(&local_50);
      if (bVar2) {
LAB_00137462:
        if (cVar1 == '\0') {
          iVar5 = 5;
        }
        else {
          *pcVar6 = cVar1;
          do {
            pcVar7 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
          } while (*pcVar7 == '/');
          iVar5 = 0;
          pcVar7 = pcVar6;
        }
      }
      else {
        __path = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        if (local_50.m_length != 0) {
          __path = local_50.m_p;
        }
        iVar4 = mkdir(__path,0x1c0);
        if (iVar4 == 0) goto LAB_00137462;
        err::setLastSystemError();
        iVar5 = 1;
        if (iVar4 == 0) goto LAB_00137462;
      }
    } while (iVar5 == 0);
    if (iVar5 != 5) {
      bVar3 = false;
    }
LAB_00137491:
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
  }
  return bVar3;
}

Assistant:

bool
ensureDirExists(const sl::StringRef& fileName0) {
	if (fileName0.isEmpty() || isDir(fileName0))
		return true;

	sl::String fileName = fileName0;

	char* p = fileName.getBuffer(); // ensure exclusive buffer (we're going to modify it)
	while (*p == '/') // skip root
		p++;

	while (*p) {
		char* p2 = p + 1;
		while (*p2 && *p2 != '/')
			p2++;

		char c = *p2; // save
		*p2 = 0;

		if (!isDir(fileName)) {
			int result = ::mkdir(fileName, S_IRWXU);
			if (result != 0)
				return err::failWithLastSystemError();
		}

		if (!c)
			break;

		*p2 = c; // restore

		p = p2 + 1;
		while (*p == '/') // skip separators
			p++;
	}

	return true;
}